

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBezierCurve.cpp
# Opt level: O3

void chrono::ChBezierCurve::solveTriDiag(size_t n,double *rhs,double *x)

{
  double dVar1;
  undefined1 auVar2 [16];
  void *pvVar3;
  ulong uVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  
  pvVar3 = operator_new__(-(ulong)(n >> 0x3d != 0) | n * 8);
  *x = *rhs * 0.5;
  if (1 < n) {
    dVar5 = *x;
    dVar8 = 2.0;
    uVar4 = 1;
    do {
      dVar1 = *(double *)(&DAT_00953940 + (ulong)(uVar4 < n - 1) * 8);
      *(double *)((long)pvVar3 + uVar4 * 8) = 1.0 / dVar8;
      dVar8 = dVar1 - 1.0 / dVar8;
      dVar5 = (rhs[uVar4] - dVar5) / dVar8;
      x[uVar4] = dVar5;
      uVar4 = uVar4 + 1;
    } while (n != uVar4);
    if (1 < n) {
      auVar6._8_8_ = 0;
      auVar6._0_8_ = x[n - 1];
      do {
        auVar7._8_8_ = 0;
        auVar7._0_8_ = *(ulong *)((long)pvVar3 + n * 8 + -8);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = x[n - 2];
        auVar6 = vfnmadd213sd_fma(auVar6,auVar7,auVar2);
        x[n - 2] = auVar6._0_8_;
        n = n - 1;
      } while (n != 1);
    }
  }
  operator_delete__(pvVar3);
  return;
}

Assistant:

void ChBezierCurve::solveTriDiag(size_t n, double* rhs, double* x) {
    double* tmp = new double[n];

    double b = 2.0;
    x[0] = rhs[0] / b;

    // Decomposition and forward substitution.
    for (size_t i = 1; i < n; i++) {
        tmp[i] = 1 / b;
        b = (i < n - 1 ? 4.0 : 3.5) - tmp[i];
        x[i] = (rhs[i] - x[i - 1]) / b;
    }

    // Backsubstitution.
    for (size_t i = 1; i < n; i++)
        x[n - i - 1] -= tmp[n - i] * x[n - i];

    delete[] tmp;
}